

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O2

void __thiscall
MapState::addRange(MapState *this,uintb st,Datatype *ct,uint4 fl,RangeType rt,int4 hi)

{
  bool bVar1;
  int size;
  long lVar2;
  RangeHint *range;
  intb sst;
  uintb local_38;
  
  if ((ct == (Datatype *)0x0) || (size = ct->size, size == 0)) {
    ct = this->defaultType;
    size = ct->size;
  }
  sst = (intb)this->spaceid;
  local_38 = st;
  bVar1 = RangeList::inRange(&this->range,(Address *)&sst,size);
  if (bVar1) {
    sst = st / this->spaceid->wordsize;
    sign_extend(&sst,this->spaceid->addressSize * 8 + -1);
    lVar2 = (ulong)this->spaceid->wordsize * sst;
    sst = lVar2;
    range = (RangeHint *)operator_new(0x30);
    range->start = st;
    range->size = size;
    range->sstart = lVar2;
    range->type = ct;
    range->flags = fl;
    range->rangeType = rt;
    range->highind = hi;
    std::vector<RangeHint_*,_std::allocator<RangeHint_*>_>::push_back(&this->maplist,&range);
  }
  return;
}

Assistant:

void MapState::addRange(uintb st,Datatype *ct,uint4 fl,RangeHint::RangeType rt,int4 hi)

{
  if ((ct == (Datatype *)0)||(ct->getSize()==0)) // Must have a real type
    ct = defaultType;
  int4 sz = ct->getSize();
  if (!range.inRange(Address(spaceid,st),sz))
    return;
  intb sst = (intb)AddrSpace::byteToAddress(st,spaceid->getWordSize());
  sign_extend(sst,spaceid->getAddrSize()*8-1);
  sst = (intb)AddrSpace::addressToByte(sst,spaceid->getWordSize());
  RangeHint *range = new RangeHint(st,sz,sst,ct,fl,rt,hi);
  maplist.push_back(range);
#ifdef OPACTION_DEBUG
  if (debugon) {
    ostringstream s;
    s << "Add Range: " << hex << st << ":" << dec << sz;
    s << " ";
    ct->printRaw(s);
    s << endl;
    glb->printDebug(s.str());
  }
#endif
}